

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartThreading.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_160264::RandomReadingTask::execute(RandomReadingTask *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int lx_00;
  int ly_00;
  int ly_01;
  int ry;
  reference pvVar5;
  Box2i b2;
  Box2i b1;
  FrameBuffer frameBuffer_1;
  int numYTiles;
  int numXTiles;
  int h;
  int w;
  int numYLevels;
  int numXLevels;
  Lock lock_1;
  TiledInputPart part_1;
  int ly;
  int lx;
  int ty2;
  int ty1;
  int tx2;
  int tx1;
  FrameBuffer frameBuffer;
  Lock lock;
  InputPart part;
  int l2;
  int l1;
  Array2D<half> hData;
  Array2D<float> fData;
  Array2D<unsigned_int> uData;
  int levelMode;
  int pixelType;
  int partType;
  int partNumber;
  int iVar6;
  int iVar7;
  int in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  undefined1 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe49;
  undefined1 in_stack_fffffffffffffe4a;
  undefined1 in_stack_fffffffffffffe4b;
  int in_stack_fffffffffffffe4c;
  Lock *in_stack_fffffffffffffe50;
  TiledInputPart *this_00;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  TiledInputPart local_138 [6];
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int in_stack_ffffffffffffff1c;
  Array2D<half> *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  int iVar8;
  int in_stack_ffffffffffffff34;
  int iVar9;
  int local_c8;
  int in_stack_ffffffffffffff3c;
  int pixelType_00;
  FrameBuffer *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff50;
  int local_78;
  int local_74;
  Array2D<half> local_70;
  Array2D<float> local_48;
  Array2D<unsigned_int> local_30;
  value_type local_18;
  value_type local_14;
  value_type local_10;
  int local_c;
  
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::size
            ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)
             (anonymous_namespace)::headers);
  local_c = random_int(in_stack_fffffffffffffe44);
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::partTypes,
                      (long)local_c);
  local_10 = *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::pixelTypes,
                      (long)local_c);
  local_14 = *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::levelModes,
                      (long)local_c);
  local_18 = *pvVar5;
  Imf_2_5::Array2D<unsigned_int>::Array2D(&local_30);
  Imf_2_5::Array2D<float>::Array2D(&local_48);
  Imf_2_5::Array2D<half>::Array2D(&local_70);
  if (local_10 == 0) {
    local_74 = random_int(in_stack_fffffffffffffe44);
    local_78 = random_int(in_stack_fffffffffffffe44);
    if (local_78 < local_74) {
      std::swap<int>(&local_74,&local_78);
    }
    Imf_2_5::InputPart::InputPart
              ((InputPart *)in_stack_fffffffffffffe50,
               (MultiPartInputFile *)
               CONCAT44(in_stack_fffffffffffffe4c,
                        CONCAT13(in_stack_fffffffffffffe4b,
                                 CONCAT12(in_stack_fffffffffffffe4a,
                                          CONCAT11(in_stack_fffffffffffffe49,
                                                   in_stack_fffffffffffffe48)))),
               in_stack_fffffffffffffe44);
    IlmThread_2_5::Lock::Lock
              (in_stack_fffffffffffffe50,
               (Mutex *)CONCAT44(in_stack_fffffffffffffe4c,
                                 CONCAT13(in_stack_fffffffffffffe4b,
                                          CONCAT12(in_stack_fffffffffffffe4a,
                                                   CONCAT11(in_stack_fffffffffffffe49,
                                                            in_stack_fffffffffffffe48)))),
               SUB41((uint)in_stack_fffffffffffffe44 >> 0x18,0));
    Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x1d27ea);
    iVar6 = 0x107;
    setInputFrameBuffer(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                        (Array2D<unsigned_int> *)
                        CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                        (Array2D<float> *)
                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                        in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                        in_stack_ffffffffffffff50);
    Imf_2_5::InputPart::setFrameBuffer
              ((InputPart *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (FrameBuffer *)CONCAT44(in_stack_fffffffffffffe3c,iVar6));
    Imf_2_5::InputPart::readPixels
              ((InputPart *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               in_stack_fffffffffffffe3c,iVar6);
    iVar6 = (int)((ulong)in_stack_fffffffffffffe50 >> 0x20);
    if (local_14 == 0) {
      bVar1 = anon_unknown.dwarf_160264::checkPixels<unsigned_int>
                        ((Array2D<unsigned_int> *)
                         CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),iVar6,
                         (int)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                         CONCAT13(in_stack_fffffffffffffe4b,
                                  CONCAT12(in_stack_fffffffffffffe4a,
                                           CONCAT11(in_stack_fffffffffffffe49,
                                                    in_stack_fffffffffffffe48))),
                         in_stack_fffffffffffffe44);
      if (!bVar1) {
        __assert_fail("checkPixels<unsigned int>(uData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x12a,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
    }
    else if (local_14 == 1) {
      bVar1 = anon_unknown.dwarf_160264::checkPixels<float>
                        ((Array2D<float> *)
                         CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),iVar6,
                         (int)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                         CONCAT13(in_stack_fffffffffffffe4b,
                                  CONCAT12(in_stack_fffffffffffffe4a,
                                           CONCAT11(in_stack_fffffffffffffe49,
                                                    in_stack_fffffffffffffe48))),
                         in_stack_fffffffffffffe44);
      if (!bVar1) {
        __assert_fail("checkPixels<float>(fData, 0, width - 1, l1, l2, width)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x12d,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
    }
    else if ((local_14 == 2) &&
            (bVar1 = anon_unknown.dwarf_160264::checkPixels<half>
                               ((Array2D<half> *)
                                CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                                in_stack_fffffffffffffe64,in_stack_fffffffffffffe60,
                                in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58,iVar6), !bVar1))
    {
      __assert_fail("checkPixels<half>(hData, 0, width - 1, l1, l2, width)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                    ,0x130,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
    }
    Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1d29e1);
    IlmThread_2_5::Lock::~Lock
              ((Lock *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  }
  else {
    Imf_2_5::TiledInputPart::TiledInputPart
              ((TiledInputPart *)in_stack_fffffffffffffe50,
               (MultiPartInputFile *)
               CONCAT44(in_stack_fffffffffffffe4c,
                        CONCAT13(in_stack_fffffffffffffe4b,
                                 CONCAT12(in_stack_fffffffffffffe4a,
                                          CONCAT11(in_stack_fffffffffffffe49,
                                                   in_stack_fffffffffffffe48)))),
               in_stack_fffffffffffffe44);
    IlmThread_2_5::Lock::Lock
              (in_stack_fffffffffffffe50,
               (Mutex *)CONCAT44(in_stack_fffffffffffffe4c,
                                 CONCAT13(in_stack_fffffffffffffe4b,
                                          CONCAT12(in_stack_fffffffffffffe4a,
                                                   CONCAT11(in_stack_fffffffffffffe49,
                                                            in_stack_fffffffffffffe48)))),
               SUB41((uint)in_stack_fffffffffffffe44 >> 0x18,0));
    local_f4 = Imf_2_5::TiledInputPart::numXLevels((TiledInputPart *)0x1d2a4a);
    local_f8 = Imf_2_5::TiledInputPart::numYLevels((TiledInputPart *)0x1d2a68);
    iVar2 = random_int(in_stack_fffffffffffffe44);
    iVar6 = random_int(in_stack_fffffffffffffe44);
    if (local_18 == 1) {
      iVar6 = iVar2;
    }
    local_fc = Imf_2_5::TiledInputPart::levelWidth
                         ((TiledInputPart *)
                          CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                          in_stack_fffffffffffffe3c);
    local_100 = Imf_2_5::TiledInputPart::levelHeight
                          ((TiledInputPart *)
                           CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                           in_stack_fffffffffffffe3c);
    iVar3 = Imf_2_5::TiledInputPart::numXTiles
                      ((TiledInputPart *)
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       in_stack_fffffffffffffe3c);
    local_104 = iVar3;
    iVar4 = Imf_2_5::TiledInputPart::numYTiles
                      ((TiledInputPart *)
                       CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                       in_stack_fffffffffffffe3c);
    local_108 = iVar4;
    lx_00 = random_int(in_stack_fffffffffffffe44);
    pixelType_00 = lx_00;
    ly_00 = random_int(in_stack_fffffffffffffe44);
    local_c8 = ly_00;
    ly_01 = random_int(in_stack_fffffffffffffe44);
    iVar9 = ly_01;
    ry = random_int(in_stack_fffffffffffffe44);
    iVar8 = ry;
    if (local_c8 < pixelType_00) {
      std::swap<int>((int *)&stack0xffffffffffffff3c,&local_c8);
    }
    if (iVar8 < iVar9) {
      std::swap<int>((int *)&stack0xffffffffffffff34,(int *)&stack0xffffffffffffff30);
    }
    this_00 = local_138;
    Imf_2_5::FrameBuffer::FrameBuffer((FrameBuffer *)0x1d2c4a);
    iVar7 = local_100;
    setInputFrameBuffer(in_stack_ffffffffffffff40,pixelType_00,
                        (Array2D<unsigned_int> *)CONCAT44(iVar9,iVar8),
                        (Array2D<float> *)CONCAT44(iVar2,iVar6),in_stack_ffffffffffffff20,
                        in_stack_ffffffffffffff1c,in_stack_ffffffffffffff50);
    Imf_2_5::TiledInputPart::setFrameBuffer
              ((TiledInputPart *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
               (FrameBuffer *)CONCAT44(in_stack_fffffffffffffe3c,iVar7));
    Imf_2_5::TiledInputPart::readTiles
              (this_00,in_stack_fffffffffffffe4c,
               CONCAT13(in_stack_fffffffffffffe4b,
                        CONCAT12(in_stack_fffffffffffffe4a,
                                 CONCAT11(in_stack_fffffffffffffe49,in_stack_fffffffffffffe48))),
               in_stack_fffffffffffffe44,in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,ly_00);
    Imf_2_5::TiledInputPart::dataWindowForTile
              ((TiledInputPart *)
               CONCAT44(in_stack_fffffffffffffe4c,
                        CONCAT13(in_stack_fffffffffffffe4b,
                                 CONCAT12(in_stack_fffffffffffffe4a,
                                          CONCAT11(in_stack_fffffffffffffe49,
                                                   in_stack_fffffffffffffe48)))),
               in_stack_fffffffffffffe44,in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,iVar6);
    Imf_2_5::TiledInputPart::dataWindowForTile
              ((TiledInputPart *)
               CONCAT44(in_stack_fffffffffffffe4c,
                        CONCAT13(in_stack_fffffffffffffe4b,
                                 CONCAT12(in_stack_fffffffffffffe4a,
                                          CONCAT11(in_stack_fffffffffffffe49,
                                                   in_stack_fffffffffffffe48)))),
               in_stack_fffffffffffffe44,in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,iVar6);
    iVar6 = (int)((ulong)this_00 >> 0x20);
    if (local_14 == 0) {
      bVar1 = anon_unknown.dwarf_160264::checkPixels<unsigned_int>
                        ((Array2D<unsigned_int> *)CONCAT44(ly_01,ry),iVar6,(int)this_00,0,
                         CONCAT13(in_stack_fffffffffffffe4b,
                                  CONCAT12(in_stack_fffffffffffffe4a,
                                           CONCAT11(in_stack_fffffffffffffe49,
                                                    in_stack_fffffffffffffe48))),
                         in_stack_fffffffffffffe44);
      if (!bVar1) {
        __assert_fail("checkPixels<unsigned int>(uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x161,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
    }
    else if (local_14 == 1) {
      bVar1 = anon_unknown.dwarf_160264::checkPixels<float>
                        ((Array2D<float> *)CONCAT44(ly_01,ry),iVar6,(int)this_00,1,
                         CONCAT13(in_stack_fffffffffffffe4b,
                                  CONCAT12(in_stack_fffffffffffffe4a,
                                           CONCAT11(in_stack_fffffffffffffe49,
                                                    in_stack_fffffffffffffe48))),
                         in_stack_fffffffffffffe44);
      if (!bVar1) {
        __assert_fail("checkPixels<float>(fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                      ,0x165,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
      }
    }
    else if ((local_14 == 2) &&
            (bVar1 = anon_unknown.dwarf_160264::checkPixels<half>
                               ((Array2D<half> *)CONCAT44(iVar3,iVar4),lx_00,ly_00,ly_01,ry,iVar6),
            !bVar1)) {
      __assert_fail("checkPixels<half>(hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y, w)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartThreading.cpp"
                    ,0x169,"virtual void (anonymous namespace)::RandomReadingTask::execute()");
    }
    Imf_2_5::FrameBuffer::~FrameBuffer((FrameBuffer *)0x1d2ecc);
    IlmThread_2_5::Lock::~Lock
              ((Lock *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  }
  Imf_2_5::Array2D<half>::~Array2D
            ((Array2D<half> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  Imf_2_5::Array2D<float>::~Array2D
            ((Array2D<float> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  Imf_2_5::Array2D<unsigned_int>::~Array2D
            ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40))
  ;
  return;
}

Assistant:

void execute()
        {
            int partNumber = random_int(headers.size());
            int partType = partTypes[partNumber];
            int pixelType = pixelTypes[partNumber];
            int levelMode = levelModes[partNumber];

            Array2D<unsigned int> uData;
            Array2D<float> fData;
            Array2D<half> hData;
            if (partType == 0)
            {
                int l1, l2;
                l1 = random_int(height);
                l2 = random_int(height);
                if (l1 > l2) swap(l1, l2);

                InputPart part(*file, partNumber);
                //
                // We add lock here to assure that two threads that accessing
                // the same part won't mess things up.
                //
                Lock lock(mutexes[partNumber]);

                FrameBuffer frameBuffer;
                setInputFrameBuffer(frameBuffer, pixelType,
                                    uData, fData, hData, width, height);

                part.setFrameBuffer(frameBuffer);
                part.readPixels(l1, l2);

                switch (pixelType)
                {
                    case 0:
                        assert(checkPixels<unsigned int>(uData, 0, width - 1, l1, l2, width));
                        break;
                    case 1:
                        assert(checkPixels<float>(fData, 0, width - 1, l1, l2, width));
                        break;
                    case 2:
                        assert(checkPixels<half>(hData, 0, width - 1, l1, l2, width));
                        break;
                }
            }
            else
            {
                int tx1, tx2, ty1, ty2;
                int lx, ly;

                TiledInputPart part(*file, partNumber);
                //
                // We add lock here to assure that two threads that accessing
                // the same part won't mess things up.
                //
                Lock lock(mutexes[partNumber]);

                int numXLevels = part.numXLevels();
                int numYLevels = part.numYLevels();

                lx = random_int(numXLevels);
                ly = random_int(numYLevels);
                if (levelMode == 1) ly = lx;

                int w = part.levelWidth(lx);
                int h = part.levelHeight(ly);

                int numXTiles = part.numXTiles(lx);
                int numYTiles = part.numYTiles(ly);
                tx1 = random_int(numXTiles);
                tx2 = random_int(numXTiles);
                ty1 = random_int(numYTiles);
                ty2 = random_int(numYTiles);
                if (tx1 > tx2) swap(tx1, tx2);
                if (ty1 > ty2) swap(ty1, ty2);

                FrameBuffer frameBuffer;
                setInputFrameBuffer(frameBuffer, pixelType,
                                    uData, fData, hData, w, h);

                part.setFrameBuffer(frameBuffer);
                part.readTiles(tx1, tx2, ty1, ty2, lx, ly);

                Box2i b1 = part.dataWindowForTile(tx1, ty1, lx, ly);
                Box2i b2 = part.dataWindowForTile(tx2, ty2, lx, ly);

                switch (pixelType)
                {
                    case 0:
                        assert(checkPixels<unsigned int>(uData, b1.min.x, b2.max.x, b1.min.y, b2.max.y,
                                                         w));
                        break;
                    case 1:
                        assert(checkPixels<float>(fData, b1.min.x, b2.max.x, b1.min.y, b2.max.y,
                                                  w));
                        break;
                    case 2:
                        assert(checkPixels<half>(hData, b1.min.x, b2.max.x, b1.min.y, b2.max.y,
                                                 w));
                        break;
                }
            }
        }